

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive.cpp
# Opt level: O1

optional<pbrt::ShapeIntersection> * __thiscall
pbrt::SimplePrimitive::Intersect
          (optional<pbrt::ShapeIntersection> *__return_storage_ptr__,SimplePrimitive *this,Ray *r,
          Float tMax)

{
  optional<pbrt::ShapeIntersection> si;
  DispatchSplit<6> local_14d;
  Float local_14c;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  local_148;
  LightHandle local_140;
  TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
  local_138;
  uintptr_t local_130;
  SurfaceInteraction local_128;
  undefined4 local_30;
  bool local_28;
  
  local_130 = (this->shape).
              super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
              .bits;
  local_14c = tMax;
  DispatchSplit<6>::operator()(&local_128,&local_14d);
  if (local_28 == false) {
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xc0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 200) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xf0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xf8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x80) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x88) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x90) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x98) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x70) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x78) = 0;
    (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
    *(undefined8 *)&__return_storage_ptr__->set = 0;
  }
  else {
    local_138.bits =
         (this->material).
         super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
         .bits;
    local_140.
    super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
    .bits = (TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
             )0;
    local_148.bits =
         (r->medium).
         super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
         .bits;
    SurfaceInteraction::SetIntersectionProperties
              (&local_128,(MaterialHandle *)&local_138,&local_140,(MediumInterface *)0x0,
               (MediumHandle *)&local_148);
    __return_storage_ptr__->set = local_28;
    if (local_28 == true) {
      *(MediumInterface **)((long)&__return_storage_ptr__->optionalValue + 0x40) =
           local_128.super_Interaction.mediumInterface;
      (__return_storage_ptr__->optionalValue).__align =
           (anon_struct_8_0_00000001_for___align)
           local_128.super_Interaction.pi.super_Point3<pbrt::Interval>.
           super_Tuple3<pbrt::Point3,_pbrt::Interval>.x;
      *(Interval *)((long)&__return_storage_ptr__->optionalValue + 8) =
           local_128.super_Interaction.pi.super_Point3<pbrt::Interval>.
           super_Tuple3<pbrt::Point3,_pbrt::Interval>.y;
      *(Interval *)((long)&__return_storage_ptr__->optionalValue + 0x10) =
           local_128.super_Interaction.pi.super_Point3<pbrt::Interval>.
           super_Tuple3<pbrt::Point3,_pbrt::Interval>.z;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) =
           local_128.super_Interaction._24_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) =
           local_128.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>._4_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) =
           local_128.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>._0_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) =
           local_128.super_Interaction._48_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) =
           local_128.super_Interaction._56_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
      ((TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
        *)((long)&__return_storage_ptr__->optionalValue + 0x48))->bits =
           (uintptr_t)
           local_128.super_Interaction.medium.
           super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
           .bits;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) =
           local_128.dpdu.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = local_128._88_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) =
           local_128.dpdv.super_Tuple3<pbrt::Vector3,_float>._4_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) =
           local_128.dndu.super_Tuple3<pbrt::Normal3,_float>._0_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x70) = local_128._112_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x78) =
           local_128.dndv.super_Tuple3<pbrt::Normal3,_float>._4_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x80) =
           local_128.shading.n.super_Tuple3<pbrt::Normal3,_float>._0_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x88) = local_128.shading._8_8_
      ;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x80) =
           local_128.shading.n.super_Tuple3<pbrt::Normal3,_float>._0_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x88) = local_128.shading._8_8_
      ;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x90) =
           local_128.shading.dpdu.super_Tuple3<pbrt::Vector3,_float>._4_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x98) =
           local_128.shading.dpdv.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa0) =
           local_128.shading._32_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa8) =
           local_128.shading.dndu.super_Tuple3<pbrt::Normal3,_float>._4_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb0) =
           local_128.shading.dndv.super_Tuple3<pbrt::Normal3,_float>._0_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb8) = local_128._184_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xc0) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 200) = 0;
      ((TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
        *)((long)&__return_storage_ptr__->optionalValue + 0xc0))->bits =
           (uintptr_t)
           local_128.material.
           super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
           .bits;
      ((TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
        *)((long)&__return_storage_ptr__->optionalValue + 200))->bits =
           (uintptr_t)
           local_128.areaLight.
           super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
           .bits;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd0) =
           local_128.dpdx.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd8) = local_128._216_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe0) =
           local_128.dpdy.super_Tuple3<pbrt::Vector3,_float>._4_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe8) = local_128._232_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xf0) = local_128._240_8_;
      *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0xf8) = local_30;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<ShapeIntersection> SimplePrimitive::Intersect(const Ray &r,
                                                             Float tMax) const {
    pstd::optional<ShapeIntersection> si = shape.Intersect(r, tMax);
    if (!si)
        return {};

    si->intr.SetIntersectionProperties(material, nullptr, nullptr, r.medium);

    return si;
}